

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aspif.cpp
# Opt level: O2

void __thiscall Potassco::AspifOutput::theoryTerm(AspifOutput *this,Id_t termId,int number)

{
  startDir(this,(Directive_t)0x9);
  add(this,0);
  add(this,termId);
  add(this,number);
  endDir(this);
  return;
}

Assistant:

void AspifOutput::theoryTerm(Id_t termId, int number) {
	startDir(Directive_t::Theory).add(Theory_t::Number).add(termId).add(number).endDir();
}